

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_334836::TestCallback::fromApp
          (TestCallback *this,Message *message,SessionID *param_2)

{
  bool bVar1;
  UnsupportedMessageType *this_00;
  allocator<char> local_91;
  string local_90;
  MsgType msgType;
  
  FIX::MsgType::MsgType(&msgType);
  FIX::FieldMap::getField((FieldMap *)(message + 0x70),(FieldBase *)&msgType);
  bVar1 = std::operator==(&msgType.super_StringField.super_FieldBase.m_string,"8");
  if (!bVar1) {
    FIX::FieldBase::~FieldBase((FieldBase *)&msgType);
    return;
  }
  this_00 = (UnsupportedMessageType *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  FIX::UnsupportedMessageType::UnsupportedMessageType(this_00,&local_90);
  __cxa_throw(this_00,&FIX::UnsupportedMessageType::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(FieldNotFound, IncorrectDataFormat, IncorrectTagValue, UnsupportedMessageType) {
    MsgType msgType;
    message.getHeader().getField(msgType);
    if (msgType == "8") {
      throw UnsupportedMessageType();
    }
  }